

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall OpenMD::Electrostatic::calcSelfCorrection(Electrostatic *this,SelfData *sdat)

{
  ElectrostaticSummationMethod EVar1;
  double dVar2;
  double dVar3;
  RealType selfPot;
  RealType fqf;
  ElectrostaticAtomData data;
  RealType local_128;
  RealType local_120;
  double local_118;
  double local_110;
  ElectrostaticAtomData local_108;
  SquareMatrix3<double> local_78;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  ElectrostaticAtomData::ElectrostaticAtomData
            (&local_108,
             (this->ElectrostaticMap).
             super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[sdat->atid]);
  local_128 = 0.0;
  local_120 = 0.0;
  local_118 = local_108.fixedCharge;
  local_110 = 0.0;
  if (local_108.is_Dipole == true) {
    local_110 = Vector<double,_3U>::lengthSquare(&local_108.dipole.super_Vector<double,_3U>);
  }
  if (local_108.is_Fluctuating != false) {
    local_118 = local_118 + sdat->flucQ;
    FluctuatingChargeForces::getSelfInteraction
              (this->flucQ_,sdat->atid,sdat->flucQ,&local_128,&local_120);
  }
  EVar1 = this->summationMethod_;
  if ((EVar1 - esm_SHIFTED_POTENTIAL < 3) || (EVar1 == esm_EWALD_FULL)) {
    if (local_108.is_Charge != false) {
      dVar2 = this->selfMult1_ * this->pre11_;
      dVar3 = sdat->skippedCharge + local_118;
      local_128 = dVar3 * dVar3 * dVar2 + local_128;
      if (local_108.is_Fluctuating != false) {
        local_120 = dVar2 * -2.0 * dVar3 + local_120;
      }
    }
    if (local_108.is_Dipole != false) {
      local_128 = this->selfMult2_ * this->pre22_ * local_110 + local_128;
    }
    if (local_108.is_Quadrupole != false) {
      local_110 = local_108.quadrupole.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_[0][0] +
                  local_108.quadrupole.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_[1][1] +
                  local_108.quadrupole.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_[2][2];
      operator*(&local_78,&local_108.quadrupole,&local_108.quadrupole);
      local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
           local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
           local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
           local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
      local_128 = (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                   [2] + local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[2][2] + local_110 * local_110) * this->selfMult4_ * this->pre44_ +
                  local_128;
      if (local_108.is_Charge != false) {
        dVar2 = this->selfMult2_ * this->pre14_;
        local_128 = local_118 * dVar2 * -2.0 * local_110 + local_128;
        if (local_108.is_Fluctuating != false) {
          local_120 = (dVar2 + dVar2) * local_110 + local_120;
        }
      }
    }
  }
  else if (EVar1 == esm_REACTION_FIELD) {
    if (local_108.is_Charge != false) {
      local_128 = (this->pre11_ * this->preRF_ * local_118 * local_118 * -0.5) / this->cutoffRadius_
                  + local_128;
    }
    if (local_108.is_Dipole != false) {
      local_128 = local_128 - this->preRF_ * this->pre22_ * local_110;
    }
  }
  (sdat->selfPot).data_[2] = (sdat->selfPot).data_[2] + local_128;
  if (sdat->isSelected == true) {
    (sdat->selePot).data_[2] = (sdat->selePot).data_[2] + local_128;
  }
  if (sdat->doParticlePot == true) {
    sdat->particlePot = local_128 + sdat->particlePot;
  }
  if (local_108.is_Fluctuating != false) {
    sdat->flucQfrc = local_120 + sdat->flucQfrc;
  }
  return;
}

Assistant:

void Electrostatic::calcSelfCorrection(SelfData& sdat) {
    if (!initialized_) initialize();

    ElectrostaticAtomData data = ElectrostaticMap[Etids[sdat.atid]];

    // logicals
    bool i_is_Charge      = data.is_Charge;
    bool i_is_Dipole      = data.is_Dipole;
    bool i_is_Quadrupole  = data.is_Quadrupole;
    bool i_is_Fluctuating = data.is_Fluctuating;
    RealType C_a          = data.fixedCharge;
    RealType selfPot(0.0), fqf(0.0), preVal, DdD(0.0), trQ, trQQ;

    if (i_is_Dipole) { DdD = data.dipole.lengthSquare(); }

    if (i_is_Fluctuating) {
      // We're now doing all of the self pieces for fluctuating charges in
      // explicit self interactions.
      C_a += sdat.flucQ;
      flucQ_->getSelfInteraction(sdat.atid, sdat.flucQ, selfPot, fqf);
    }

    switch (summationMethod_) {
    case esm_REACTION_FIELD:

      if (i_is_Charge) {
        // Self potential [see Wang and Hermans, "Reaction Field
        // Molecular Dynamics Simulation with Friedman’s Image Charge
        // Method," J. Phys. Chem. 99, 12001-12007 (1995).]
        preVal = pre11_ * preRF_ * C_a * C_a;
        selfPot -= 0.5 * preVal / cutoffRadius_;
        // if (i_is_Fluctuating) {
        //  fqf += pre11_ * preRF_ * C_a / cutoffRadius_;
        //}
      }

      if (i_is_Dipole) { selfPot -= pre22_ * preRF_ * DdD; }

      break;

    case esm_SHIFTED_FORCE:
    case esm_SHIFTED_POTENTIAL:
    case esm_TAYLOR_SHIFTED:
    case esm_EWALD_FULL:
      if (i_is_Charge) {
        selfPot += selfMult1_ * pre11_ * pow(C_a + sdat.skippedCharge, 2);
        if (i_is_Fluctuating) {
          fqf -= selfMult1_ * pre11_ * 2.0 * (C_a + sdat.skippedCharge);
        }
      }
      if (i_is_Dipole) selfPot += selfMult2_ * pre22_ * DdD;
      if (i_is_Quadrupole) {
        trQ  = data.quadrupole.trace();
        trQQ = (data.quadrupole * data.quadrupole).trace();
        selfPot += selfMult4_ * pre44_ * (2.0 * trQQ + trQ * trQ);
        if (i_is_Charge) {
          selfPot -= selfMult2_ * pre14_ * 2.0 * C_a * trQ;
          if (i_is_Fluctuating) { fqf += selfMult2_ * pre14_ * 2.0 * trQ; }
        }
      }
      break;
    default:
      break;
    }

    sdat.selfPot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.isSelected) sdat.selePot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.doParticlePot) { sdat.particlePot += selfPot; }

    if (i_is_Fluctuating) sdat.flucQfrc += fqf;
  }